

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O0

string * extractModelName(string *filename)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string *in_RSI;
  string *in_RDI;
  size_t found;
  string *name;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_70 [48];
  string local_40 [32];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  uVar2 = std::__cxx11::string::find_last_of((char *)in_RDI,0x86ffb5);
  local_20 = uVar2;
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
  }
  local_20 = std::__cxx11::string::find_last_of((char *)in_RDI,0x88c9b3);
  std::__cxx11::string::substr((ulong)local_70,(ulong)in_RDI);
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_70);
  uVar2 = local_20;
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)in_RDI,uVar2);
    local_20 = std::__cxx11::string::find_last_of((char *)in_RDI,0x88c9b3);
  }
  uVar2 = local_20;
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    uVar2 = local_20;
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)in_RDI,uVar2);
  }
  return in_RDI;
}

Assistant:

std::string extractModelName(const std::string filename) {
  // Extract model name
  std::string name = filename;
  std::size_t found = name.find_last_of("/\\");
  if (found < name.size()) name = name.substr(found + 1);
  found = name.find_last_of(".");
  if (name.substr(found + 1) == "gz"
      //      || name.substr(found + 1) == "zip"
  ) {
    name.erase(found, name.size() - found);
    found = name.find_last_of(".");
  }
  if (found < name.size()) name.erase(found, name.size() - found);
  return name;
}